

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall
gulcalc::writemode1output
          (gulcalc *this,int event_id,OASIS_FLOAT tiv,
          vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *gilv,bool correlated)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  pointer pgVar4;
  mapped_type *this_00;
  pointer ppVar5;
  pointer pgVar6;
  __normal_iterator<gulSampleslevelRec_*,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>
  local_c8;
  __normal_iterator<gulSampleslevelRec_*,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>
  local_c0;
  iterator iter2;
  gulitemSampleslevel g;
  _Self local_a0;
  iterator iter;
  value_type local_90;
  gulSampleslevelRec gg;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_80;
  iterator iter_1;
  ulong local_68;
  size_t i;
  _func_void_vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_ptr_OASIS_FLOAT *split_tiv;
  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  gxi;
  bool correlated_local;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  *gilv_local;
  OASIS_FLOAT tiv_local;
  int event_id_local;
  gulcalc *this_local;
  
  gxi._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = correlated;
  if (this->alloc_rule_ == 2) {
    setmaxloss(this,gilv);
  }
  std::
  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  ::map((map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
         *)&split_tiv);
  if (this->alloc_rule_ == 3) {
    i = (size_t)split_tiv_multiplicative;
  }
  else {
    i = (size_t)split_tiv_classic;
  }
  local_68 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
            ::size(gilv);
    if (sVar2 <= local_68) break;
    if ((local_68 != (long)(this->num_idx_ + -2)) || (local_68 != (long)(this->num_idx_ + -4))) {
      pvVar3 = std::
               vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ::operator[](gilv,local_68);
      (*(code *)i)(tiv,pvVar3);
    }
    pvVar3 = std::
             vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
             ::operator[](gilv,local_68);
    local_80._M_current =
         (gulItemIDLoss *)std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::begin(pvVar3);
    while( true ) {
      pvVar3 = std::
               vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ::operator[](gilv,local_68);
      gg = (gulSampleslevelRec)
           std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::end(pvVar3);
      bVar1 = __gnu_cxx::operator!=
                        (&local_80,
                         (__normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                          *)&gg);
      if (!bVar1) break;
      local_90.sidx = (int)local_68 - this->num_idx_;
      pgVar4 = __gnu_cxx::
               __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
               ::operator->(&local_80);
      local_90.loss = (OASIS_FLOAT)pgVar4->loss;
      pgVar4 = __gnu_cxx::
               __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
               ::operator->(&local_80);
      this_00 = std::
                map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                ::operator[]((map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                              *)&split_tiv,&pgVar4->item_id);
      std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>::push_back
                (this_00,&local_90);
      iter._M_node = (_Base_ptr)
                     __gnu_cxx::
                     __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                     ::operator++(&local_80,0);
    }
    local_68 = local_68 + 1;
  }
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
       ::begin((map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                *)&split_tiv);
  while( true ) {
    g._8_8_ = std::
              map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
              ::end((map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                     *)&split_tiv);
    bVar1 = std::operator!=(&local_a0,(_Self *)&g.sidx);
    if (!bVar1) break;
    iter2._M_current._0_4_ = event_id;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>
             ::operator->(&local_a0);
    iter2._M_current._4_4_ = ppVar5->first;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>
             ::operator->(&local_a0);
    local_c0._M_current =
         (gulSampleslevelRec *)
         std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>::begin
                   (&ppVar5->second);
    while( true ) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>
               ::operator->(&local_a0);
      local_c8._M_current =
           (gulSampleslevelRec *)
           std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>::end
                     (&ppVar5->second);
      bVar1 = __gnu_cxx::operator!=(&local_c0,&local_c8);
      if (!bVar1) break;
      pgVar6 = __gnu_cxx::
               __normal_iterator<gulSampleslevelRec_*,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>
               ::operator->(&local_c0);
      g.event_id = pgVar6->sidx;
      pgVar6 = __gnu_cxx::
               __normal_iterator<gulSampleslevelRec_*,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>
               ::operator->(&local_c0);
      g.item_id = (int)pgVar6->loss;
      if ((gxi._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
        itemoutputgul(this,(gulitemSampleslevel *)&iter2);
      }
      else {
        correlatedoutputgul(this,(gulitemSampleslevel *)&iter2);
      }
      __gnu_cxx::
      __normal_iterator<gulSampleslevelRec_*,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>
      ::operator++(&local_c0,0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>
    ::operator++(&local_a0,0);
  }
  std::
  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  ::~map((map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
          *)&split_tiv);
  return;
}

Assistant:

void gulcalc::writemode1output(const int event_id, const OASIS_FLOAT tiv,
			       std::vector<std::vector<gulItemIDLoss>> &gilv,
			       const bool correlated=false) {

	// Set losses for alloc rule where
	// total peril loss = maximum subperil loss
	if (alloc_rule_ == 2) setmaxloss(gilv);

	std::map<int, std::vector<gulSampleslevelRec>> gxi;

    // select tiv split method depending on alloc_rule_
    void (*split_tiv)(std::vector<gulItemIDLoss> &, OASIS_FLOAT);
    if (alloc_rule_==3) split_tiv = &split_tiv_multiplicative;
    else split_tiv = &split_tiv_classic;
	// Check whether the sum of losses per sample exceed TIV
	// If so, split TIV in proportion to losses
	for (size_t i = 0; i < gilv.size(); i++) {

		if ((i != num_idx_ + std_dev_idx) ||
		    (i != num_idx_ + number_of_affected_risk_idx)) {
			split_tiv(gilv[i], tiv);
		}

		auto iter = gilv[i].begin();
		while (iter != gilv[i].end()) {

			gulSampleslevelRec gg;
			gg.sidx = i - num_idx_;
			gg.loss = iter->loss;

			gxi[iter->item_id].push_back(gg);
			iter++;

		}

	}

	// Output all items associated with current coverage ID
	// Output the rows here
	auto iter = gxi.begin();
	while (iter != gxi.end()) {
		gulitemSampleslevel g;
		g.event_id = event_id;
		g.item_id = iter->first;
		auto iter2 = iter->second.begin();
		while (iter2 != iter->second.end()) {
			g.sidx = iter2->sidx;
			g.loss = iter2->loss;
			if (correlated) correlatedoutputgul(g);
			else itemoutputgul(g);
			iter2++;
		}
		iter++;
	}

}